

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintTopBoilerplate(Generator *this)

{
  Printer *pPVar1;
  int32_t iVar2;
  char *pcVar3;
  string *args_9;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  string_view local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  AlphaNum local_190;
  string local_160;
  AlphaNum local_130;
  string local_100;
  AlphaNum local_e0;
  string local_b0;
  char *local_90;
  string_view local_88;
  Version *local_78;
  Version *version;
  string_view local_68;
  byte local_51;
  undefined1 auStack_50 [7];
  bool runtime_version_disabled;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  Generator *local_10;
  Generator *this_local;
  
  pPVar1 = this->printer_;
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "# -*- coding: utf-8 -*-\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# NO CHECKED-IN PROTOBUF GENCODE\n# source: $filename$\n"
            );
  local_30 = FileDescriptor::name(this->file_);
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar1,local_20,(char (*) [9])"filename",&local_30);
  if ((this->opensource_runtime_ & 1U) != 0) {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"# Protobuf Python Version: $protobuf_python_version$\n");
    io::Printer::Print<char[24],char[11]>
              (pPVar1,local_40,(char (*) [24])"protobuf_python_version",(char (*) [11])"6.31.0-dev")
    ;
  }
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_50,
             "\"\"\"Generated protocol buffer code.\"\"\"\n");
  io::Printer::Print<>(pPVar1,_auStack_50);
  local_51 = 0;
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,
             "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import descriptor_pool as _descriptor_pool\n$runtime_version_import$from google.protobuf import symbol_database as _symbol_database\nfrom google.protobuf.internal import builder as _builder\n"
            );
  pcVar3 = "from google.protobuf import runtime_version as _runtime_version\n";
  if ((local_51 & 1) != 0) {
    pcVar3 = "";
  }
  version = (Version *)pcVar3;
  io::Printer::Print<char[23],char_const*>
            (pPVar1,local_68,(char (*) [23])"runtime_version_import",(char **)&version);
  if ((local_51 & 1) == 0) {
    local_78 = GetProtobufPythonVersion((bool)(this->opensource_runtime_ & 1));
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,
               "_runtime_version.ValidateProtobufRuntimeVersion(\n    $domain$,\n    $major$,\n    $minor$,\n    $patch$,\n    \'$suffix$\',\n    \'$location$\'\n)\n"
              );
    local_90 = "_runtime_version.Domain.GOOGLE_INTERNAL";
    if ((this->opensource_runtime_ & 1U) != 0) {
      local_90 = "_runtime_version.Domain.PUBLIC";
    }
    iVar2 = Version::major(local_78);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,iVar2);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)&local_e0,a);
    iVar2 = Version::minor(local_78);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_130,iVar2);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_100,(lts_20250127 *)&local_130,a_00);
    iVar2 = Version::patch(local_78);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_190,iVar2);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_160,(lts_20250127 *)&local_190,a_01);
    args_9 = Version::suffix_abi_cxx11_(local_78);
    local_1a0 = FileDescriptor::name(this->file_);
    io::Printer::
    Print<char[7],char_const*,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar1,local_88,(char (*) [7])"domain",&local_90,(char (*) [6])"major",&local_b0,
               (char (*) [6])"minor",&local_100,(char (*) [6])"patch",&local_160,
               (char (*) [7])0xa12f1a,args_9,(char (*) [9])0xa793eb,&local_1a0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b0,"# @@protoc_insertion_point(imports)\n\n");
  io::Printer::Print<>(pPVar1,local_1b0);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c0,"_sym_db = _symbol_database.Default()\n");
  io::Printer::Print<>(pPVar1,local_1c0);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"\n\n");
  io::Printer::Print<>(pPVar1,local_1d0);
  return;
}

Assistant:

void Generator::PrintTopBoilerplate() const {
  // TODO: Allow parameterization of Python version?
  printer_->Print(
      "# -*- coding: utf-8 -*-\n"
      "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "# NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "# source: $filename$\n",
      "filename", file_->name());
  if (opensource_runtime_) {
    printer_->Print("# Protobuf Python Version: $protobuf_python_version$\n",
                    "protobuf_python_version", PROTOBUF_PYTHON_VERSION_STRING);
  }
  printer_->Print("\"\"\"Generated protocol buffer code.\"\"\"\n");
  bool runtime_version_disabled = false;
  printer_->Print(
      "from google.protobuf import descriptor as _descriptor\n"
      "from google.protobuf import descriptor_pool as _descriptor_pool\n"
      "$runtime_version_import$"
      "from google.protobuf import symbol_database as _symbol_database\n"
      "from google.protobuf.internal import builder as _builder\n",
      "runtime_version_import",
      runtime_version_disabled ? ""
                               : "from google.protobuf import runtime_version "
                                 "as _runtime_version\n");
  if (!runtime_version_disabled) {
    const auto& version = GetProtobufPythonVersion(opensource_runtime_);
    printer_->Print(
        "_runtime_version.ValidateProtobufRuntimeVersion(\n"
        "    $domain$,\n"
        "    $major$,\n"
        "    $minor$,\n"
        "    $patch$,\n"
        "    '$suffix$',\n"
        "    '$location$'\n"
        ")\n",
        "domain",
        opensource_runtime_ ? "_runtime_version.Domain.PUBLIC"
                            : "_runtime_version.Domain.GOOGLE_INTERNAL",
        "major", absl::StrCat(version.major()), "minor",
        absl::StrCat(version.minor()), "patch", absl::StrCat(version.patch()),
        "suffix", version.suffix(), "location", file_->name());
  }
  printer_->Print("# @@protoc_insertion_point(imports)\n\n");
  printer_->Print("_sym_db = _symbol_database.Default()\n");
  printer_->Print("\n\n");
}